

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

int32_t __thiscall icu_63::RegexCompile::buildOp(RegexCompile *this,int32_t type,int32_t val)

{
  UBool UVar1;
  uint local_20;
  int local_1c;
  int32_t val_local;
  int32_t type_local;
  RegexCompile *this_local;
  
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 != '\0') {
    return 0;
  }
  if ((type < 0) || (local_1c = type, 0xff < type)) {
    error(this,U_REGEX_ERROR_START);
    local_1c = 0;
  }
  local_20 = val;
  if (0xffffff < val) {
    error(this,U_REGEX_ERROR_START);
    local_20 = 0;
  }
  if ((int)local_20 < 0) {
    if ((local_1c != 0xff) && (local_1c != 0)) {
      error(this,U_REGEX_ERROR_START);
      return -1;
    }
    if (local_20 >> 0x18 != 0xff) {
      error(this,U_REGEX_ERROR_START);
      return -1;
    }
    local_1c = 0xff;
  }
  return local_1c << 0x18 | local_20;
}

Assistant:

int32_t RegexCompile::buildOp(int32_t type, int32_t val) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    if (type < 0 || type > 255) {
        U_ASSERT(FALSE);
        error(U_REGEX_INTERNAL_ERROR);
        type = URX_RESERVED_OP;
    }
    if (val > 0x00ffffff) {
        U_ASSERT(FALSE);
        error(U_REGEX_INTERNAL_ERROR);
        val = 0;
    }
    if (val < 0) {
        if (!(type == URX_RESERVED_OP_N || type == URX_RESERVED_OP)) {
            U_ASSERT(FALSE);
            error(U_REGEX_INTERNAL_ERROR);
            return -1;
        }
        if (URX_TYPE(val) != 0xff) {
            U_ASSERT(FALSE);
            error(U_REGEX_INTERNAL_ERROR);
            return -1;
        }
        type = URX_RESERVED_OP_N;
    }
    return (type << 24) | val;
}